

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_OperatorEquals_Test<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_OperatorEquals_Test<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *pdVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  bool bVar4;
  char *pcVar5;
  char *in_R9;
  pair<unsigned_long,_unsigned_long> pVar6;
  pair<google::dense_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
  p;
  TypeParam ht1;
  TypeParam ht2;
  undefined1 local_170 [8];
  undefined8 *local_168;
  key_equal local_160;
  AssertHelper local_150;
  undefined1 local_148 [32];
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_128;
  undefined1 local_a0 [8];
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_98;
  
  local_148._0_8_ =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_148._8_8_ = local_148._8_8_ & 0xffffffff00000000;
  local_170 = (undefined1  [8])0x0;
  local_168 = (undefined8 *)((ulong)local_168 & 0xffffffff00000000);
  local_a0 = (undefined1  [8])((ulong)local_a0 & 0xffffffff00000000);
  local_98.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher
  ._0_8_ = (int *)0x0;
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            (&local_128,0,(hasher *)local_148,(key_equal *)local_170,(allocator_type *)local_a0);
  local_170 = (undefined1  [8])0x0;
  local_168 = (undefined8 *)((ulong)local_168 & 0xffffffff00000000);
  local_160._0_8_ = (long *)0x0;
  local_160.num_compares_ = 0;
  local_148._0_8_ = local_148._0_8_ & 0xffffffff00000000;
  local_148._8_8_ = (pointer)0x0;
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)local_a0,0,(hasher *)local_170,&local_160,(allocator_type *)local_148);
  pcVar5 = UniqueObjectHelper<char_const*>(1);
  pdVar1 = &local_128.
            super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_;
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&pdVar1->rep);
  local_128.
  super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.use_deleted_
       = true;
  local_128.
  super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.rep.key_info.delkey = pcVar5;
  pcVar5 = UniqueObjectHelper<char_const*>(2);
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&local_98);
  local_98.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.use_deleted_
       = true;
  local_98.key_info.delkey = pcVar5;
  local_170 = (undefined1  [8])UniqueObjectHelper<char_const*>(10);
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&pdVar1->rep,1);
  google::
  dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::insert_noresize<char_const*const&,char_const*const&>
            ((pair<google::dense_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
              *)local_148,
             (dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
              *)pdVar1,(char **)local_170,(char **)local_170);
  local_170 = (undefined1  [8])UniqueObjectHelper<char_const*>(0x14);
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&local_98,1);
  google::
  dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::insert_noresize<char_const*const&,char_const*const&>
            ((pair<google::dense_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
              *)local_148,
             (dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
              *)&local_98,(char **)local_170,(char **)local_170);
  bVar4 = google::
          dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&pdVar1->rep,&local_98);
  local_168 = (undefined8 *)0x0;
  local_170[0] = (internal)!bVar4;
  if (bVar4) {
    testing::Message::Message((Message *)&local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_148,(internal *)local_170,(AssertionResult *)"ht1 == ht2","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x197,(char *)local_148._0_8_);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if ((dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_148._0_8_ !=
        (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)(local_148 + 0x10)) {
      operator_delete((void *)local_148._0_8_);
    }
    if ((long *)local_160._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_160._0_8_ + 8))();
    }
    puVar2 = local_168;
    if (local_168 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_168 != local_168 + 2) {
        operator_delete((undefined8 *)*local_168);
      }
      operator_delete(puVar2);
    }
  }
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator=(&pdVar1->rep,&local_98);
  local_170[0] = (internal)
                 google::
                 dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                 ::operator==(&pdVar1->rep,&local_98);
  local_168 = (undefined8 *)0x0;
  if (!(bool)local_170[0]) {
    testing::Message::Message((Message *)&local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_148,(internal *)local_170,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x199,(char *)local_148._0_8_);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if ((dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)local_148._0_8_ !=
        (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)(local_148 + 0x10)) {
      operator_delete((void *)local_148._0_8_);
    }
    if ((long *)local_160._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_160._0_8_ + 8))();
    }
    puVar2 = local_168;
    if (local_168 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_168 != local_168 + 2) {
        operator_delete((undefined8 *)*local_168);
      }
      operator_delete(puVar2);
    }
  }
  local_a0 = (undefined1  [8])&PTR__BaseHashtableInterface_00c195f8;
  if (local_98.table != (pointer)0x0) {
    free(local_98.table);
  }
  local_128.
  super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c195f8;
  if (local_128.
      super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
      .ht_.rep.table != (pointer)0x0) {
    free(local_128.
         super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.rep.table);
  }
  local_148._0_8_ =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_148._8_8_ = local_148._8_8_ & 0xffffffff00000000;
  local_170 = (undefined1  [8])0x0;
  local_168 = (undefined8 *)((ulong)local_168 & 0xffffffff00000000);
  local_a0 = (undefined1  [8])((ulong)local_a0 & 0xffffffff00000000);
  local_98.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher
  ._0_8_ = (int *)0x0;
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            (&local_128,0,(hasher *)local_148,(key_equal *)local_170,(allocator_type *)local_a0);
  local_170 = (undefined1  [8])0x0;
  local_168 = (undefined8 *)((ulong)local_168 & 0xffffffff00000000);
  local_160.id_ = 0;
  local_160.num_hashes_ = 0;
  local_160.num_compares_ = 0;
  local_148._0_8_ = local_148._0_8_ & 0xffffffff00000000;
  local_148._8_8_ = (pointer)0x0;
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)local_a0,0,(hasher *)local_170,&local_160,(allocator_type *)local_148);
  local_170 = (undefined1  [8])UniqueObjectHelper<char_const*>(0x1e);
  pdVar1 = &local_128.
            super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_;
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&pdVar1->rep,1);
  google::
  dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::insert_noresize<char_const*const&,char_const*const&>
            ((pair<google::dense_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
              *)local_148,
             (dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
              *)pdVar1,(char **)local_170,(char **)local_170);
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator=(&pdVar1->rep,&local_98);
  local_160._0_8_ = local_160._0_8_ & 0xffffffff00000000;
  local_170 = (undefined1  [8])
              (local_128.
               super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.num_elements -
              local_128.
              super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.rep.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_148,"0u","ht1.size()",(uint *)&local_160,(unsigned_long *)local_170);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_170);
    if ((pointer)local_148._8_8_ == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_148._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x19f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_160,(Message *)local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_160);
    if (local_170 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_170 + 8))();
    }
  }
  uVar3 = local_148._8_8_;
  if ((pointer)local_148._8_8_ != (pointer)0x0) {
    if (*(pointer *)local_148._8_8_ != (pointer)(local_148._8_8_ + 0x10)) {
      operator_delete(*(pointer *)local_148._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_a0 = (undefined1  [8])&PTR__BaseHashtableInterface_00c195f8;
  if (local_98.table != (pointer)0x0) {
    free(local_98.table);
  }
  local_128.
  super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c195f8;
  if (local_128.
      super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
      .ht_.rep.table != (pointer)0x0) {
    free(local_128.
         super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.rep.table);
  }
  local_148._0_8_ =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_148._8_8_ = local_148._8_8_ & 0xffffffff00000000;
  local_170 = (undefined1  [8])0x0;
  local_168 = (undefined8 *)((ulong)local_168 & 0xffffffff00000000);
  local_a0 = (undefined1  [8])((ulong)local_a0 & 0xffffffff00000000);
  local_98.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher
  ._0_8_ = (int *)0x0;
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            (&local_128,0,(hasher *)local_148,(key_equal *)local_170,(allocator_type *)local_a0);
  local_170 = (undefined1  [8])0x0;
  local_168 = (undefined8 *)((ulong)local_168 & 0xffffffff00000000);
  local_160.id_ = 0;
  local_160.num_hashes_ = 0;
  local_160.num_compares_ = 0;
  local_148._0_8_ = local_148._0_8_ & 0xffffffff00000000;
  local_148._8_8_ = (pointer)0x0;
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)local_a0,0,(hasher *)local_170,&local_160,(allocator_type *)local_148);
  pcVar5 = UniqueObjectHelper<char_const*>(1);
  pdVar1 = &local_128.
            super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_;
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&pdVar1->rep);
  local_128.
  super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.use_deleted_
       = true;
  local_128.
  super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.rep.key_info.delkey = pcVar5;
  local_170 = (undefined1  [8])UniqueObjectHelper<char_const*>(1);
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&local_98,1);
  google::
  dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::insert_noresize<char_const*const&,char_const*const&>
            ((pair<google::dense_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
              *)local_148,
             (dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
              *)&local_98,(char **)local_170,(char **)local_170);
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator=(&pdVar1->rep,&local_98);
  local_160.id_ = 1;
  local_170 = (undefined1  [8])
              (local_128.
               super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.num_elements -
              local_128.
              super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.rep.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_148,"1u","ht1.size()",(uint *)&local_160,(unsigned_long *)local_170);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_170);
    if ((pointer)local_148._8_8_ == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_148._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1a6,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_160,(Message *)local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_160);
    if (local_170 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_170 + 8))();
    }
  }
  uVar3 = local_148._8_8_;
  if ((pointer)local_148._8_8_ != (pointer)0x0) {
    if (*(pointer *)local_148._8_8_ != (pointer)(local_148._8_8_ + 0x10)) {
      operator_delete(*(pointer *)local_148._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_150.data_._0_4_ = 1;
  local_160._0_8_ = UniqueObjectHelper<char_const*>(1);
  pVar6 = google::
          dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
          ::find_position<char_const*>
                    ((dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                      *)pdVar1,(char **)&local_160);
  local_170._1_7_ = 0;
  local_170[0] = (internal)(pVar6.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_148,"1u","ht1.count(this->UniqueKey(1))",(uint *)&local_150,
             (unsigned_long *)local_170);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_170);
    if ((pointer)local_148._8_8_ == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_148._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1a7,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_160,(Message *)local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_160);
    if (local_170 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_170 + 8))();
    }
  }
  uVar3 = local_148._8_8_;
  if ((pointer)local_148._8_8_ != (pointer)0x0) {
    if (*(pointer *)local_148._8_8_ != (pointer)(local_148._8_8_ + 0x10)) {
      operator_delete(*(pointer *)local_148._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_a0 = (undefined1  [8])&PTR__BaseHashtableInterface_00c195f8;
  if (local_98.table != (pointer)0x0) {
    free(local_98.table);
  }
  local_128.
  super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c195f8;
  if (local_128.
      super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
      .ht_.rep.table != (pointer)0x0) {
    free(local_128.
         super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.rep.table);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, OperatorEquals) {
  {
    TypeParam ht1, ht2;
    ht1.set_deleted_key(this->UniqueKey(1));
    ht2.set_deleted_key(this->UniqueKey(2));

    ht1.insert(this->UniqueObject(10));
    ht2.insert(this->UniqueObject(20));
    EXPECT_FALSE(ht1 == ht2);
    ht1 = ht2;
    EXPECT_TRUE(ht1 == ht2);
  }
  {
    TypeParam ht1, ht2;
    ht1.insert(this->UniqueObject(30));
    ht1 = ht2;
    EXPECT_EQ(0u, ht1.size());
  }
  {
    TypeParam ht1, ht2;
    ht1.set_deleted_key(this->UniqueKey(1));
    ht2.insert(this->UniqueObject(1));  // has same key as ht1.delkey
    ht1 = ht2;                          // should reset deleted-key to 'unset'
    EXPECT_EQ(1u, ht1.size());
    EXPECT_EQ(1u, ht1.count(this->UniqueKey(1)));
  }
}